

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Reader.cpp
# Opt level: O2

AS02IndexReader * __thiscall
AS_02::MXF::AS02IndexReader::InitFromBuffer
          (AS02IndexReader *this,byte_t *p,ui32_t l,ui64_t *body_offset,
          ui64_t *essence_container_offset)

{
  long *plVar1;
  long lVar2;
  ILogSink *pIVar3;
  undefined4 in_register_00000014;
  undefined8 *in_R9;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined **local_98;
  undefined1 local_90;
  undefined8 local_8f;
  undefined8 uStack_87;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000014,l);
  if (*(long *)(p + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Reader.cpp"
                  ,0xff,
                  "ASDCP::Result_t AS_02::MXF::AS02IndexReader::InitFromBuffer(const byte_t *, ui32_t, const ui64_t &, const ui64_t &)"
                 );
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  puVar5 = (undefined8 *)(((ulong)body_offset & 0xffffffff) + (long)puVar4);
LAB_0013aac6:
  do {
    if ((*(int *)this < 0) || (puVar5 <= puVar4)) {
      if (*(int *)this < 0) {
        pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar3,"Failed to initialize AS02IndexReader.\n");
      }
      return this;
    }
    local_90 = 1;
    local_8f = *puVar4;
    uStack_87 = puVar4[1];
    local_98 = &PTR__IArchive_00168cc8;
    plVar1 = (long *)ASDCP::MXF::CreateObject(*(Dictionary **)(p + 0x78),(UL *)&local_98);
    if (plVar1 == (long *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Reader.cpp"
                    ,0x107,
                    "ASDCP::Result_t AS_02::MXF::AS02IndexReader::InitFromBuffer(const byte_t *, ui32_t, const ui64_t &, const ui64_t &)"
                   );
    }
    plVar1[10] = *(long *)(p + 0x150);
    (**(code **)(*plVar1 + 0x28))((Result_t *)&local_98,plVar1,puVar4,(int)puVar5 - (int)puVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_98);
    Kumu::Result_t::~Result_t((Result_t *)&local_98);
    puVar4 = (undefined8 *)((long)puVar4 + (ulong)*(uint *)(plVar1 + 2) + plVar1[4]);
    if (*(int *)this < 0) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"Error initializing index segment packet.\n");
    }
    else {
      lVar2 = __dynamic_cast(plVar1,&ASDCP::MXF::InterchangeObject::typeinfo,
                             &ASDCP::MXF::IndexTableSegment::typeinfo,0);
      if (lVar2 != 0) {
        *(undefined8 *)(lVar2 + 0xa0) = *in_R9;
        *(ui64_t *)(lVar2 + 0xa8) = *essence_container_offset;
        ASDCP::MXF::Partition::PacketList::AddPacket(*(InterchangeObject **)(p + 0x70));
        goto LAB_0013aac6;
      }
    }
    (**(code **)(*plVar1 + 8))(plVar1);
  } while( true );
}

Assistant:

ASDCP::Result_t
AS_02::MXF::AS02IndexReader::InitFromBuffer(const byte_t* p, ui32_t l, const ui64_t& body_offset, const ui64_t& essence_container_offset)
{
  assert(m_Dict);
  Result_t result = RESULT_OK;
  const byte_t* end_p = p + l;

  while ( KM_SUCCESS(result) && p < end_p )
    {
      // parse the packets and index them by uid, discard KLVFill items
      InterchangeObject* object = CreateObject(m_Dict, p);
      assert(object);

      object->m_Lookup = m_Lookup;
      result = object->InitFromBuffer(p, end_p - p);
      p += object->PacketLength();

      if ( KM_SUCCESS(result) )
	{
	  IndexTableSegment *segment = dynamic_cast<IndexTableSegment*>(object);

	  if ( segment != 0 )
	    {
	      segment->RtFileOffset = essence_container_offset;
	      segment->RtEntryOffset = body_offset;
	      m_PacketList->AddPacket(object); // takes ownership
	    }
	  else
	    {
	      delete object;
	    }
	}
      else
	{
	  DefaultLogSink().Error("Error initializing index segment packet.\n");
	  delete object;
	}
    }

  if ( KM_FAILURE(result) )
    {
      DefaultLogSink().Error("Failed to initialize AS02IndexReader.\n");
    }

  return result;
}